

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O3

void __thiscall
Assimp::X3DImporter::ParseHelper_FixTruncatedFloatString
          (X3DImporter *this,char *pInStr,string *pOutString)

{
  size_t sVar1;
  char cVar2;
  size_t sVar3;
  
  pOutString->_M_string_length = 0;
  *(pOutString->_M_dataplus)._M_p = '\0';
  sVar1 = strlen(pInStr);
  if (sVar1 != 0) {
    std::__cxx11::string::reserve((ulong)pOutString);
    cVar2 = (char)pOutString;
    if (*pInStr == '.') {
      std::__cxx11::string::push_back(cVar2);
    }
    std::__cxx11::string::push_back(cVar2);
    if (sVar1 != 1) {
      sVar3 = 1;
      do {
        if (((pInStr[sVar3] == '.') && ((ulong)(byte)pInStr[sVar3 - 1] < 0x2e)) &&
           ((0x280100000200U >> ((ulong)(byte)pInStr[sVar3 - 1] & 0x3f) & 1) != 0)) {
          std::__cxx11::string::push_back(cVar2);
        }
        std::__cxx11::string::push_back(cVar2);
        sVar3 = sVar3 + 1;
      } while (sVar1 != sVar3);
    }
  }
  return;
}

Assistant:

void X3DImporter::ParseHelper_FixTruncatedFloatString(const char* pInStr, std::string& pOutString)
{
	pOutString.clear();
    const size_t instr_len = strlen(pInStr);
    if ( 0 == instr_len )
    {
        return;
    }

	pOutString.reserve(instr_len * 3 / 2);
	// check and correct floats in format ".x". Must be "x.y".
    if ( pInStr[ 0 ] == '.' )
    {
        pOutString.push_back( '0' );
    }

	pOutString.push_back(pInStr[0]);
	for(size_t ci = 1; ci < instr_len; ci++)
	{
		if((pInStr[ci] == '.') && ((pInStr[ci - 1] == ' ') || (pInStr[ci - 1] == '-') || (pInStr[ci - 1] == '+') || (pInStr[ci - 1] == '\t')))
		{
			pOutString.push_back('0');
			pOutString.push_back('.');
		}
		else
		{
			pOutString.push_back(pInStr[ci]);
		}
	}
}